

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O3

BBox<2> * Omega_h::find_bounding_box<2>(BBox<2> *__return_storage_ptr__,Reals *coords)

{
  int *piVar1;
  ulong uVar2;
  Alloc *this;
  bool bVar3;
  BBox<2> init;
  Alloc *local_68;
  
  this = (coords->write_).shared_alloc_.alloc;
  if (((ulong)this & 1) == 0) {
    uVar2 = this->size;
  }
  else {
    uVar2 = (ulong)this >> 3;
  }
  if (((uint)uVar2 >> 3 & 1) == 0) {
    if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        this = (Alloc *)(this->size * 8 + 1);
      }
      else {
        this->use_count = this->use_count + 1;
      }
    }
    bVar3 = ((ulong)this & 7) == 0;
    local_68 = this;
    if (bVar3 && this != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(this->size * 8 + 1);
      }
      else {
        this->use_count = this->use_count + 1;
      }
    }
    transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
              (__return_storage_ptr__,(Omega_h *)0x0,(int)(uVar2 >> 3) >> 1);
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      piVar1 = &local_68->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68);
        operator_delete(local_68,0x48);
      }
    }
    if (bVar3 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}